

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.h
# Opt level: O0

ChVector<double> * __thiscall
chrono::ChCoordsys<double>::TransformParentToLocal
          (ChVector<double> *__return_storage_ptr__,ChCoordsys<double> *this,
          ChVector<double> *parent)

{
  ChVector<double> local_38;
  ChVector<double> *local_20;
  ChVector<double> *parent_local;
  ChCoordsys<double> *this_local;
  
  local_20 = parent;
  parent_local = &this->pos;
  this_local = (ChCoordsys<double> *)__return_storage_ptr__;
  ChVector<double>::operator-(&local_38,parent,&this->pos);
  ChQuaternion<double>::RotateBack(__return_storage_ptr__,&this->rot,&local_38);
  return __return_storage_ptr__;
}

Assistant:

ChVector<Real> TransformParentToLocal(const ChVector<Real>& parent) const { return rot.RotateBack(parent - pos); }